

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O0

Am_Wrapper * __thiscall
Object_Key_Offset_Store_Data::Make_Unique(Object_Key_Offset_Store_Data *this)

{
  bool bVar1;
  Object_Key_Offset_Store_Data *this_local;
  
  bVar1 = Am_Wrapper::Is_Unique(&this->super_Am_Wrapper);
  this_local = this;
  if (!bVar1) {
    Am_Wrapper::Release(&this->super_Am_Wrapper);
    this_local = (Object_Key_Offset_Store_Data *)operator_new(0x28);
    Object_Key_Offset_Store_Data(this_local,this);
  }
  return &this_local->super_Am_Wrapper;
}

Assistant:

static Am_Value
offset_from_object_procedure(Am_Object & /*self*/)
{
  Am_Value value;
  Object_Key_Offset_Store_Data *store =
      (Object_Key_Offset_Store_Data *)Am_Object_Advanced::Get_Context()
          ->Get_Data();
  value = (store->object).Get(store->key);
  store->Release();
  modify_value(value, store->offset, store->multiplier);
  return value;
}